

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerStats.cpp
# Opt level: O0

ostream * operator<<(ostream *out,LayerStats *stats)

{
  ostream *poVar1;
  char shift;
  LayerStats *stats_local;
  ostream *out_local;
  
  std::operator<<(out,"{\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"SynapseStats: ");
  poVar1 = operator<<(poVar1,&stats->synapseWeight);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"NeuronMPThresh: ");
  poVar1 = operator<<(poVar1,&stats->neuronMPMax);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"NeuronMP: ");
  poVar1 = operator<<(poVar1,&stats->neuronMP);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"InducedPotential: ");
  poVar1 = operator<<(poVar1,&stats->neuronMPInduced);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"InducedSpikes: ");
  poVar1 = operator<<(poVar1,&stats->inducedSpikes);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"SpikesStats: ");
  poVar1 = operator<<(poVar1,&stats->spikes);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"GradVStats: ");
  poVar1 = operator<<(poVar1,&stats->gradV);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,'\t');
  poVar1 = std::operator<<(poVar1,"GradWStats: ");
  poVar1 = operator<<(poVar1,&stats->gradW);
  std::operator<<(poVar1,"\n");
  std::operator<<(out,"}\n");
  return out;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const LayerStats &stats )
{
    char shift = '\t';
    out << "{\n";
    out << shift << "SynapseStats: " << stats.synapseWeight << "\n";
    out << shift << "NeuronMPThresh: " << stats.neuronMPMax << "\n";
    out << shift << "NeuronMP: " << stats.neuronMP << "\n";
    out << shift << "InducedPotential: " << stats.neuronMPInduced << "\n";
    out << shift << "InducedSpikes: " << stats.inducedSpikes << "\n";
    out << shift << "SpikesStats: " << stats.spikes << "\n";
    out << shift << "GradVStats: " << stats.gradV << "\n";
    out << shift << "GradWStats: " << stats.gradW << "\n";
    out << "}\n";
    return out;
}